

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O3

bool anon_unknown.dwarf_1c1be9::RenderTargetImpl::isActive(Uint64 id)

{
  Uint64 UVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  UVar1 = sf::Context::getActiveContextId();
  if ((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap._16_8_ != 0) {
    lVar2 = 0x1d5b10;
    lVar3 = (anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap._16_8_;
    do {
      bVar4 = *(ulong *)(lVar3 + 0x20) < UVar1;
      if (!bVar4) {
        lVar2 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)bVar4 * 8);
    } while (lVar3 != 0);
    if ((lVar2 != 0x1d5b10) && (*(ulong *)(lVar2 + 0x20) <= UVar1)) {
      return *(Uint64 *)(lVar2 + 0x28) == id;
    }
  }
  return false;
}

Assistant:

bool isActive(sf::Uint64 id)
        {
            ContextRenderTargetMap::iterator iter = contextRenderTargetMap.find(sf::Context::getActiveContextId());

            if ((iter == contextRenderTargetMap.end()) || (iter->second != id))
                return false;

            return true;
        }